

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_impl<AbstractModuleClient,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,AbstractModuleClient *param_2,char *name,first_type fn,
          def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  char *pcVar1;
  vector3<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *in_RDI;
  AbstractModuleClient *in_R8;
  undefined8 in_R9;
  default_call_policies *in_stack_ffffffffffffff98;
  vector3<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *f;
  object local_48;
  undefined8 local_40;
  vector3<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  AbstractModuleClient *local_30;
  char *local_28;
  undefined8 local_20;
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *local_18;
  vector3<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  AbstractModuleClient *local_8;
  
  local_40 = in_R9;
  local_38 = in_RCX;
  local_30 = in_R8;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_RCX;
  local_8 = in_R8;
  detail::
  def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::policies((def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_RDI);
  detail::
  def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::keywords((def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)in_RDI);
  f = local_38;
  detail::
  get_signature<AbstractModuleClient,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient,std::__cxx11::string>
            ((first_type)local_38,local_30);
  make_function<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string),boost::python::default_call_policies,boost::python::detail::keywords<0ul>,boost::mpl::vector3<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&,std::__cxx11::string>>
            ((first_type)f,in_stack_ffffffffffffff98,(keywords<0UL> *)in_R8,in_RCX);
  pcVar1 = detail::
           def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           ::doc((def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                  *)0x406019);
  objects::add_to_namespace((object *)in_RDI,in_RDX,&local_48,pcVar1);
  api::object::~object((object *)0x40604b);
  def_default<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (in_RDI,local_28,local_38,local_30,local_40);
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }